

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

int hydro_unpad(uchar *buf,size_t padded_buflen,size_t blocksize)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong local_18;
  size_t pad_len;
  
  iVar3 = -1;
  local_18 = 0;
  if (blocksize - 1 < padded_buflen) {
    pbVar1 = buf + (padded_buflen - 1);
    uVar4 = 0;
    bVar5 = 0;
    uVar6 = 0;
    do {
      uVar2 = uVar6 + 0x1ff;
      uVar6 = uVar6 | *pbVar1;
      uVar2 = (*pbVar1 ^ 0x80) - 1 & (int)local_18 + 0x1ffU & uVar2;
      pbVar1 = pbVar1 + -1;
      uVar7 = -(ulong)((uVar2 >> 8 & 1) != 0) & uVar4;
      bVar5 = bVar5 | (byte)(uVar2 >> 8) & 1;
      uVar4 = uVar4 + 1;
      local_18 = local_18 | uVar7;
    } while (blocksize != uVar4);
    if (bVar5 != 0) {
      iVar3 = ((int)padded_buflen + -1) - (int)local_18;
    }
  }
  return iVar3;
}

Assistant:

int
hydro_unpad(const unsigned char *buf, size_t padded_buflen, size_t blocksize)
{
    const unsigned char *tail;
    unsigned char        acc = 0U;
    unsigned char        c;
    unsigned char        valid   = 0U;
    volatile size_t      pad_len = 0U;
    size_t               i;
    size_t               is_barrier;

    if (padded_buflen < blocksize || blocksize <= 0U) {
        return -1;
    }
    tail = &buf[padded_buflen - 1U];

    for (i = 0U; i < blocksize; i++) {
        c          = *(tail - i);
        is_barrier = (((acc - 1U) & (pad_len - 1U) & ((c ^ 0x80) - 1U)) >> 8) & 1U;
        acc |= c;
        pad_len |= i & (1U + ~is_barrier);
        valid |= (unsigned char) is_barrier;
    }
    if (valid == 0) {
        return -1;
    }
    return (int) (padded_buflen - 1 - pad_len);
}